

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::SupportedInStage
          (ShaderImageLoadStoreBase *this,int stage,int required)

{
  int required_local;
  int stage_local;
  ShaderImageLoadStoreBase *this_local;
  
  switch(stage) {
  case 0:
    this_local._7_1_ = SupportedInVS(this,required);
    break;
  case 1:
    this_local._7_1_ = SupportedInTCS(this,required);
    break;
  case 2:
    this_local._7_1_ = SupportedInTES(this,required);
    break;
  case 3:
    this_local._7_1_ = SupportedInGS(this,required);
    break;
  default:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SupportedInStage(int stage, int required)
	{
		switch (stage)
		{
		case 0:
			return SupportedInVS(required);
		case 1:
			return SupportedInTCS(required);
		case 2:
			return SupportedInTES(required);
		case 3:
			return SupportedInGS(required);
		default:
			return true;
		}
	}